

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopySuffix(CordRepBtree *this,size_t offset)

{
  ulong new_length;
  CordRep *pCVar1;
  undefined1 *begin_00;
  size_t offset_00;
  CordRepBtree *pCVar2;
  Position PVar3;
  CopyResult CVar4;
  CordRepBtree *nsub;
  CordRep *edge;
  size_t begin;
  CordRepBtree *sub;
  Position pos;
  CordRep *back;
  size_t len;
  CordRepBtree *node;
  size_t sStack_28;
  int height;
  size_t offset_local;
  CordRepBtree *this_local;
  CopyResult result;
  
  if ((this->super_CordRep).length <= offset) {
    __assert_fail("offset < this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,700,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
  }
  node._4_4_ = CordRepBtree::height(this);
  new_length = (this->super_CordRep).length - offset;
  pos.n = (size_t)Edge(this,kBack);
  len = (size_t)this;
  sStack_28 = offset;
  while (new_length <= *(ulong *)pos.n) {
    sStack_28 = *(long *)pos.n - new_length;
    node._4_4_ = node._4_4_ + -1;
    if (node._4_4_ < 0) {
      pCVar1 = CordRep::Ref((CordRep *)pos.n);
      this_local = (CordRepBtree *)anon_unknown_0::MakeSubstring(pCVar1,sStack_28);
      result.edge._0_4_ = node._4_4_;
      goto LAB_00606a1a;
    }
    len = (size_t)CordRep::btree((CordRep *)pos.n);
    pos.n = (size_t)Edge((CordRepBtree *)len,kBack);
  }
  if (sStack_28 == 0) {
    this_local = (CordRepBtree *)CordRep::Ref((CordRep *)len);
    result.edge._0_4_ = node._4_4_;
  }
  else {
    _sub = IndexBeyond((CordRepBtree *)len,sStack_28);
    this_local = CopyToEndFrom((CordRepBtree *)len,(size_t)sub,new_length);
    result.edge._0_4_ = node._4_4_;
    begin = (size_t)this_local;
    while (pos.index != 0) {
      if (sub == (CordRepBtree *)0x0) {
        __assert_fail("pos.index >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x2de,"CopyResult absl::cord_internal::CordRepBtree::CopySuffix(size_t)");
      }
      begin_00 = (undefined1 *)((long)sub[-1].edges_ + 0x2f);
      set_begin((CordRepBtree *)begin,(size_t)begin_00);
      pCVar1 = Edge((CordRepBtree *)len,(size_t)begin_00);
      offset_00 = pCVar1->length - pos.index;
      node._4_4_ = node._4_4_ + -1;
      if (node._4_4_ < 0) {
        pCVar1 = CordRep::Ref(pCVar1);
        pCVar1 = anon_unknown_0::MakeSubstring(pCVar1,offset_00,pos.index);
        *(CordRep **)(begin + 0x10 + (long)begin_00 * 8) = pCVar1;
        goto LAB_00606a1a;
      }
      len = (size_t)CordRep::btree(pCVar1);
      PVar3 = IndexBeyond((CordRepBtree *)len,offset_00);
      nsub = (CordRepBtree *)PVar3.index;
      pCVar2 = CopyToEndFrom((CordRepBtree *)len,(size_t)nsub,pos.index);
      *(CordRepBtree **)(begin + 0x10 + (long)begin_00 * 8) = pCVar2;
      begin = (size_t)pCVar2;
      _sub = PVar3;
    }
    set_begin((CordRepBtree *)begin,(size_t)sub);
  }
LAB_00606a1a:
  CVar4.height = (int)result.edge;
  CVar4.edge = &this_local->super_CordRep;
  CVar4._12_4_ = 0;
  return CVar4;
}

Assistant:

CopyResult CordRepBtree::CopySuffix(size_t offset) {
  assert(offset < this->length);

  // As long as `offset` starts inside the last edge, we can 'drop' the current
  // depth. For the most extreme example: if offset references the last data
  // edge in the tree, there is only a single edge / path from the top of the
  // tree to that last edge, so we can drop all the nodes except that edge.
  // The fast path check for this is `back->length >= length - offset`.
  int height = this->height();
  CordRepBtree* node = this;
  size_t len = node->length - offset;
  CordRep* back = node->Edge(kBack);
  while (back->length >= len) {
    offset = back->length - len;
    if (--height < 0) {
      return {MakeSubstring(CordRep::Ref(back), offset), height};
    }
    node = back->btree();
    back = node->Edge(kBack);
  }
  if (offset == 0) return {CordRep::Ref(node), height};

  // Offset does not point into the last edge, so we span at least two edges.
  // Find the index of offset with `IndexBeyond` which provides us the edge
  // 'beyond' the offset if offset is not a clean starting point of an edge.
  Position pos = node->IndexBeyond(offset);
  CordRepBtree* sub = node->CopyToEndFrom(pos.index, len);
  const CopyResult result = {sub, height};

  // `pos.n` contains a non zero value if the offset is not an exact starting
  // point of an edge. In this case, `pos.n` contains the 'trailing' amount of
  // bytes of the edge preceding that in `pos.index`. We need to iteratively
  // adjust the preceding edge with the 'broken' offset until we have a perfect
  // start of the edge.
  while (pos.n != 0) {
    assert(pos.index >= 1);
    const size_t begin = pos.index - 1;
    sub->set_begin(begin);
    CordRep* const edge = node->Edge(begin);

    len = pos.n;
    offset = edge->length - len;

    if (--height < 0) {
      sub->edges_[begin] = MakeSubstring(CordRep::Ref(edge), offset, len);
      return result;
    }

    node = edge->btree();
    pos = node->IndexBeyond(offset);

    CordRepBtree* nsub = node->CopyToEndFrom(pos.index, len);
    sub->edges_[begin] = nsub;
    sub = nsub;
  }
  sub->set_begin(pos.index);
  return result;
}